

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment.cpp
# Opt level: O1

clock_t experiment::forwardExperiment(uint cashSize)

{
  int iVar1;
  undefined4 *puVar2;
  clock_t cVar3;
  clock_t cVar4;
  uint uVar5;
  undefined4 uVar6;
  ulong uVar7;
  
  uVar5 = cashSize * 0x100;
  puVar2 = (undefined4 *)operator_new__((ulong)uVar5 * 4);
  if (uVar5 != 0) {
    uVar7 = 0;
    do {
      iVar1 = rand();
      puVar2[uVar7] = iVar1;
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
  }
  cVar3 = clock();
  uVar6 = 0;
  iVar1 = 1000;
  do {
    if (uVar5 != 0) {
      uVar6 = puVar2[uVar5 - 1];
    }
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  cVar4 = clock();
  *puVar2 = uVar6;
  operator_delete__(puVar2);
  return cVar4 - cVar3;
}

Assistant:

clock_t experiment::forwardExperiment(unsigned int cashSize)
{
    clock_t start, finish;
    int *a = new int[cashSize * 256];
    for(unsigned int i = 0; i < cashSize * 256; ++i)
    {
        a[i] = rand();
    }
    int newA=0;
    start = clock();
    for(unsigned int i = 0; i < 1000; ++i)
    {
       for(unsigned int j = 0; j < cashSize * 256; ++j)
       {
           newA = a[j];
       }
    }
    finish = clock();
    a[0]=newA;
    delete[]a;
    return finish - start;
}